

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

QByteArray * __thiscall QByteArray::insert(QByteArray *this,qsizetype i,QByteArrayView data)

{
  qsizetype *pqVar1;
  Data *pDVar2;
  char *pcVar3;
  QByteArrayView data_00;
  size_t __n;
  size_t __n_00;
  char *data_01;
  long lVar4;
  long in_FS_OFFSET;
  char *str;
  QVarLengthArray<char,_256LL> a;
  char *local_168;
  back_insert_iterator<QVarLengthArray<char,_256LL>_> local_160;
  undefined1 local_158 [16];
  qsizetype local_148;
  QVLABase<char> local_58;
  long local_38;
  
  data_01 = data.m_data;
  __n = data.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_168 = data_01;
  if (0 < (long)__n && -1 < i) {
    lVar4 = (this->d).size;
    if (i < lVar4) {
      pDVar2 = (this->d).d;
      if (((pDVar2 == (Data *)0x0) ||
          (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
         (pcVar3 = (this->d).ptr, pcVar3 + lVar4 <= data_01 || data_01 < pcVar3)) {
        QtPrivate::QPodArrayOps<char>::insert((QPodArrayOps<char> *)this,i,data_01,__n);
        (this->d).ptr[(this->d).size] = '\0';
      }
      else {
        memset((QVarLengthArray<char,_256LL> *)local_158,0xaa,0x118);
        local_58.super_QVLABaseBase.a = 0x100;
        local_58.super_QVLABaseBase.s = 0;
        local_58.super_QVLABaseBase.ptr = (QVarLengthArray<char,_256LL> *)local_158;
        if (0x100 < (long)__n) {
          QVLABase<char>::reallocate_impl(&local_58,0x100,local_158,0,__n);
        }
        local_160.container = (QVarLengthArray<char,_256LL> *)local_158;
        if (0 < (long)__n) {
          lVar4 = __n + 1;
          do {
            std::back_insert_iterator<QVarLengthArray<char,_256LL>_>::operator=(&local_160,data_01);
            data_01 = data_01 + 1;
            lVar4 = lVar4 + -1;
          } while (1 < lVar4);
        }
        data_00.m_data = (storage_type *)local_58.super_QVLABaseBase.ptr;
        data_00.m_size = local_58.super_QVLABaseBase.s;
        this = insert(this,i,data_00);
        if ((QVarLengthArray<char,_256LL> *)local_58.super_QVLABaseBase.ptr !=
            (QVarLengthArray<char,_256LL> *)local_158) {
          QtPrivate::sizedFree(local_58.super_QVLABaseBase.ptr,local_58.super_QVLABaseBase.a);
        }
      }
    }
    else {
      local_158._0_8_ = (QArrayData *)0x0;
      local_158._8_8_ = (char *)0x0;
      local_148 = 0;
      QArrayDataPointer<char>::detachAndGrow
                (&this->d,GrowsAtEnd,(__n + i) - lVar4,&local_168,
                 (QArrayDataPointer<char> *)local_158);
      lVar4 = (this->d).size;
      __n_00 = i - lVar4;
      if (__n_00 != 0) {
        (this->d).size = i;
        memset((this->d).ptr + lVar4,0x20,__n_00);
      }
      if (__n != 0) {
        memcpy((this->d).ptr + (this->d).size,local_168,__n);
        pqVar1 = &(this->d).size;
        *pqVar1 = *pqVar1 + __n;
      }
      (this->d).ptr[(this->d).size] = '\0';
      if ((QArrayData *)local_158._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_158._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_158._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_158._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_158._0_8_,1,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray &QByteArray::insert(qsizetype i, QByteArrayView data)
{
    const char *str = data.data();
    qsizetype size = data.size();
    if (i < 0 || size <= 0)
        return *this;

    // handle this specially, as QArrayDataOps::insert() doesn't handle out of
    // bounds positions
    if (i >= d->size) {
        // In case when data points into the range or is == *this, we need to
        // defer a call to free() so that it comes after we copied the data from
        // the old memory:
        DataPointer detached{};  // construction is free
        d.detachAndGrow(Data::GrowsAtEnd, (i - d.size) + size, &str, &detached);
        Q_CHECK_PTR(d.data());
        d->copyAppend(i - d->size, ' ');
        d->copyAppend(str, str + size);
        d.data()[d.size] = '\0';
        return *this;
    }

    if (!d->needsDetach() && QtPrivate::q_points_into_range(str, d)) {
        QVarLengthArray a(str, str + size);
        return insert(i, a);
    }

    d->insert(i, str, size);
    d.data()[d.size] = '\0';
    return *this;
}